

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nn.cpp
# Opt level: O0

void __thiscall ANN::~ANN(ANN *this)

{
  long in_RDI;
  ANNpointArray *in_stack_ffffffffffffffd0;
  
  annDeallocPts(in_stack_ffffffffffffffd0);
  annDeallocPt((ANNpoint *)in_stack_ffffffffffffffd0);
  if (*(void **)(in_RDI + 0x30) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 0x30));
  }
  if (*(void **)(in_RDI + 0x18) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x18));
  }
  if (*(void **)(in_RDI + 0x20) != (void *)0x0) {
    operator_delete(*(void **)(in_RDI + 0x20));
  }
  if (*(long **)(in_RDI + 0x28) != (long *)0x0) {
    (**(code **)(**(long **)(in_RDI + 0x28) + 8))();
  }
  return;
}

Assistant:

ANN::~ANN() {
    annDeallocPts(data_pts);  // deallocate data points
    annDeallocPt(query_pt);   // deallocate query points
    delete[] node_indices;    // deallocate point indices
    delete (nn_idx);          // deallocate the near neighbors indices
    delete (dists);           // deallocate the near neighbors distances
    delete (the_tree);        // deastroy the ANN tree
}